

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ArgSortLayerParams::SerializeWithCachedSizes
          (ArgSortLayerParams *this,CodedOutputStream *output)

{
  if (this->axis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(1,this->axis_,output);
  }
  if (this->descending_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(2,true,output);
    return;
  }
  return;
}

Assistant:

void ArgSortLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ArgSortLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // bool descending = 2;
  if (this->descending() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->descending(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ArgSortLayerParams)
}